

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::ValidateMessageOptions
          (DescriptorBuilder *this,Descriptor *message,DescriptorProto *proto)

{
  long lVar1;
  string *element_name;
  Type *pTVar2;
  Type *proto_00;
  Type *proto_01;
  Type *descriptor;
  long lVar3;
  int i;
  long lVar4;
  SubstituteArg *in_stack_fffffffffffffda8;
  SubstituteArg local_230;
  SubstituteArg local_200;
  SubstituteArg local_1d0;
  SubstituteArg local_1a0;
  SubstituteArg local_170;
  SubstituteArg local_140;
  SubstituteArg local_110;
  SubstituteArg local_e0;
  SubstituteArg local_b0;
  string local_80;
  SubstituteArg local_60;
  
  lVar3 = 0;
  for (lVar4 = 0; lVar4 < *(int *)(message + 0x2c); lVar4 = lVar4 + 1) {
    lVar1 = *(long *)(message + 0x30);
    pTVar2 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                       (&(proto->field_).super_RepeatedPtrFieldBase,(int)lVar4);
    ValidateFieldOptions(this,(FieldDescriptor *)(lVar1 + lVar3),pTVar2);
    lVar3 = lVar3 + 0x78;
  }
  lVar3 = 0;
  for (lVar4 = 0; lVar4 < *(int *)(message + 0x38); lVar4 = lVar4 + 1) {
    lVar1 = *(long *)(message + 0x40);
    proto_00 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                         (&(proto->nested_type_).super_RepeatedPtrFieldBase,(int)lVar4);
    ValidateMessageOptions(this,(Descriptor *)(lVar1 + lVar3),proto_00);
    lVar3 = lVar3 + 0x78;
  }
  lVar3 = 0;
  for (lVar4 = 0; lVar4 < *(int *)(message + 0x48); lVar4 = lVar4 + 1) {
    lVar1 = *(long *)(message + 0x50);
    proto_01 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                         (&(proto->enum_type_).super_RepeatedPtrFieldBase,(int)lVar4);
    ValidateEnumOptions(this,(EnumDescriptor *)(lVar1 + lVar3),proto_01);
    lVar3 = lVar3 + 0x38;
  }
  lVar3 = 0;
  for (lVar4 = 0; lVar4 < *(int *)(message + 0x68); lVar4 = lVar4 + 1) {
    lVar1 = *(long *)(message + 0x70);
    pTVar2 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                       (&(proto->extension_).super_RepeatedPtrFieldBase,(int)lVar4);
    ValidateFieldOptions(this,(FieldDescriptor *)(lVar1 + lVar3),pTVar2);
    lVar3 = lVar3 + 0x78;
  }
  lVar3 = 0x1fffffff;
  if (*(char *)(*(long *)(message + 0x20) + 0x58) != '\0') {
    lVar3 = 0x7fffffff;
  }
  for (lVar4 = 0; lVar4 < *(int *)(message + 0x58); lVar4 = lVar4 + 1) {
    if (lVar3 + 1 < (long)*(int *)(*(long *)(message + 0x60) + 4 + lVar4 * 8)) {
      element_name = *(string **)(message + 8);
      descriptor = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                             (&(proto->extension_range_).super_RepeatedPtrFieldBase,(int)lVar4);
      strings::internal::SubstituteArg::SubstituteArg(&local_60,lVar3);
      local_b0.text_ = (char *)0x0;
      local_b0.size_ = -1;
      local_e0.text_ = (char *)0x0;
      local_e0.size_ = -1;
      local_110.text_ = (char *)0x0;
      local_110.size_ = -1;
      local_140.text_ = (char *)0x0;
      local_140.size_ = -1;
      local_170.text_ = (char *)0x0;
      local_170.size_ = -1;
      local_1a0.text_ = (char *)0x0;
      local_1a0.size_ = -1;
      local_1d0.text_ = (char *)0x0;
      local_1d0.size_ = -1;
      local_200.text_ = (char *)0x0;
      local_200.size_ = -1;
      local_230.text_ = (char *)0x0;
      local_230.size_ = -1;
      strings::Substitute_abi_cxx11_
                (&local_80,(strings *)"Extension numbers cannot be greater than $0.",
                 (char *)&local_60,&local_b0,&local_e0,&local_110,&local_140,&local_170,&local_1a0,
                 &local_1d0,&local_200,&local_230,in_stack_fffffffffffffda8);
      AddError(this,element_name,&descriptor->super_Message,NUMBER,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateMessageOptions(Descriptor* message,
                                               const DescriptorProto& proto) {
  VALIDATE_OPTIONS_FROM_ARRAY(message, field, Field);
  VALIDATE_OPTIONS_FROM_ARRAY(message, nested_type, Message);
  VALIDATE_OPTIONS_FROM_ARRAY(message, enum_type, Enum);
  VALIDATE_OPTIONS_FROM_ARRAY(message, extension, Field);

  const int64 max_extension_range =
      static_cast<int64>(message->options().message_set_wire_format() ?
                         kint32max :
                         FieldDescriptor::kMaxNumber);
  for (int i = 0; i < message->extension_range_count(); ++i) {
    if (message->extension_range(i)->end > max_extension_range + 1) {
      AddError(
          message->full_name(), proto.extension_range(i),
          DescriptorPool::ErrorCollector::NUMBER,
          strings::Substitute("Extension numbers cannot be greater than $0.",
                              max_extension_range));
    }
  }
}